

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTime.h
# Opt level: O2

double GetTimeElapsedChronoQuick(CHRONO *pChrono)

{
  long lVar1;
  long lVar2;
  timespec local_20;
  
  if (pChrono->Suspended == 0) {
    clock_gettime(4,&local_20);
    local_20.tv_nsec = local_20.tv_nsec + (pChrono->Duration).tv_nsec;
    lVar1 = (local_20.tv_nsec / 1000000000 + local_20.tv_sec + (pChrono->Duration).tv_sec) -
            (pChrono->Start).tv_sec;
    lVar2 = local_20.tv_nsec % 1000000000 - (pChrono->Start).tv_nsec;
    if (lVar2 < 0) {
      lVar1 = lVar1 + ~((ulong)-lVar2 / 1000000000);
      lVar2 = 1000000000 - (ulong)-lVar2 % 1000000000;
    }
  }
  else {
    lVar1 = (pChrono->Duration).tv_sec;
    lVar2 = (pChrono->Duration).tv_nsec;
  }
  return (double)lVar2 / 1000000000.0 + (double)lVar1;
}

Assistant:

inline double GetTimeElapsedChronoQuick(CHRONO* pChrono)
{
	struct timespec temp;

	if (pChrono->Suspended)
	{
		return pChrono->Duration.tv_sec+(double)pChrono->Duration.tv_nsec/1000000000.0;
	}
	else
	{
		clock_gettime(CLOCK_MONOTONIC_RAW, &temp);

		//*pDuration = pChrono->Duration+temp-pChrono->Start

		temp.tv_sec += pChrono->Duration.tv_sec; // Seconds.
		temp.tv_nsec += pChrono->Duration.tv_nsec; // Additional nanoseconds.
		// tv_nsec must stay in [0,1000000000].
		temp.tv_sec += temp.tv_nsec/1000000000;
		temp.tv_nsec = temp.tv_nsec%1000000000;

		temp.tv_sec -= pChrono->Start.tv_sec;
		temp.tv_nsec -= pChrono->Start.tv_nsec;
		// tv_nsec must stay in [0,1000000000].
		if (temp.tv_nsec < 0)
		{
			temp.tv_sec += -1+temp.tv_nsec/1000000000;
			temp.tv_nsec = 1000000000+temp.tv_nsec%1000000000;
		}

		return temp.tv_sec+(double)temp.tv_nsec/1000000000.0;
	}
}